

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  BYTE **ppBVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long_long uVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  BYTE *pBVar7;
  bool bVar8;
  uint uVar9;
  U32 UVar10;
  U32 UVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  size_t code;
  int iVar15;
  long lVar16;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t code_00;
  uint uVar17;
  uint uVar18;
  ulong srcSize_00;
  ZSTD_CCtx_params *pZVar19;
  undefined8 *puVar20;
  BYTE *ip;
  size_t sVar21;
  ulong uVar22;
  ZSTD_CCtx_params in_stack_fffffffffffffef8;
  int *local_80;
  int *local_78;
  
  if (cctx->stage == ZSTDcs_created) {
    code_00 = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      uVar4 = cctx->pledgedSrcSizePlusOne;
      UVar11 = cctx->dictID;
      pZVar19 = &cctx->appliedParams;
      puVar20 = (undefined8 *)&stack0xfffffffffffffef8;
      for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
        *puVar20 = *(undefined8 *)pZVar19;
        pZVar19 = (ZSTD_CCtx_params *)&(pZVar19->cParams).chainLog;
        puVar20 = puVar20 + 1;
      }
      sVar14 = ZSTD_writeFrameHeader(dst,dstCapacity,in_stack_fffffffffffffef8,uVar4 - 1,UVar11);
      uVar9 = ZSTD_isError(sVar14);
      if (uVar9 != 0) {
        return sVar14;
      }
      dstCapacity = dstCapacity - sVar14;
      local_78 = (int *)((long)dst + sVar14);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      sVar14 = 0;
      local_78 = (int *)dst;
    }
    code_00 = sVar14;
    if (srcSize != 0) {
      pBVar5 = (cctx->blockState).matchState.window.nextSrc;
      if (pBVar5 != (BYTE *)src) {
        pBVar6 = (cctx->blockState).matchState.window.base;
        lVar16 = (long)pBVar5 - (long)pBVar6;
        UVar11 = (cctx->blockState).matchState.window.dictLimit;
        (cctx->blockState).matchState.window.lowLimit = UVar11;
        UVar10 = (U32)lVar16;
        (cctx->blockState).matchState.window.dictLimit = UVar10;
        (cctx->blockState).matchState.window.dictBase = pBVar6;
        (cctx->blockState).matchState.window.base = (BYTE *)((long)src - lVar16);
        if (UVar10 - UVar11 < 8) {
          (cctx->blockState).matchState.window.lowLimit = UVar10;
        }
      }
      pBVar6 = (BYTE *)((long)src + srcSize);
      (cctx->blockState).matchState.window.nextSrc = pBVar6;
      pBVar7 = (cctx->blockState).matchState.window.dictBase;
      uVar9 = (cctx->blockState).matchState.window.dictLimit;
      code_00 = (size_t)uVar9;
      if (src < pBVar7 + code_00 && pBVar7 + (cctx->blockState).matchState.window.lowLimit < pBVar6)
      {
        uVar17 = (uint)((long)pBVar6 - (long)pBVar7);
        if ((long)code_00 < (long)pBVar6 - (long)pBVar7) {
          uVar17 = uVar9;
        }
        (cctx->blockState).matchState.window.lowLimit = uVar17;
      }
      if (pBVar5 != (BYTE *)src) {
        (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
      }
      pBVar5 = (cctx->blockState).matchState.window.base;
      iVar12 = (int)pBVar5;
      if (0xe0000000 < (uint)((int)pBVar6 - iVar12)) {
        UVar11 = (cctx->blockState).matchState.window.lowLimit;
        uVar17 = (int)src - iVar12;
        uVar17 = uVar17 - ((~(-1 << ((char)(cctx->appliedParams).cParams.chainLog -
                                     (ZSTD_lazy2 < (cctx->appliedParams).cParams.strategy) & 0x1fU))
                           & uVar17) + UVar11);
        (cctx->blockState).matchState.window.base = pBVar5 + uVar17;
        (cctx->blockState).matchState.window.dictBase = pBVar7 + uVar17;
        (cctx->blockState).matchState.window.lowLimit = UVar11 - uVar17;
        (cctx->blockState).matchState.window.dictLimit = uVar9 - uVar17;
        ZSTD_reduceIndex(cctx,uVar17);
        uVar9 = (cctx->blockState).matchState.nextToUpdate;
        UVar11 = uVar9 - uVar17;
        if (uVar9 < uVar17) {
          UVar11 = 0;
        }
        (cctx->blockState).matchState.nextToUpdate = UVar11;
        (cctx->blockState).matchState.loadedDictEnd = 0;
        code_00 = extraout_RDX;
      }
      if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
        pBVar5 = (cctx->ldmState).window.nextSrc;
        if (pBVar5 != (BYTE *)src) {
          pBVar7 = (cctx->ldmState).window.base;
          lVar16 = (long)pBVar5 - (long)pBVar7;
          uVar9 = (cctx->ldmState).window.dictLimit;
          code_00 = (size_t)uVar9;
          (cctx->ldmState).window.lowLimit = uVar9;
          UVar11 = (U32)lVar16;
          (cctx->ldmState).window.dictLimit = UVar11;
          (cctx->ldmState).window.dictBase = pBVar7;
          (cctx->ldmState).window.base = (BYTE *)((long)src - lVar16);
          if (UVar11 - uVar9 < 8) {
            (cctx->ldmState).window.lowLimit = UVar11;
          }
        }
        (cctx->ldmState).window.nextSrc = pBVar6;
        pBVar5 = (cctx->ldmState).window.dictBase;
        code_00 = CONCAT71((int7)(code_00 >> 8),pBVar6 <= pBVar5 + (cctx->ldmState).window.lowLimit)
        ;
        uVar9 = (cctx->ldmState).window.dictLimit;
        if (src < pBVar5 + uVar9 && pBVar6 > pBVar5 + (cctx->ldmState).window.lowLimit) {
          uVar17 = (uint)((long)pBVar6 - (long)pBVar5);
          if ((long)(ulong)uVar9 < (long)pBVar6 - (long)pBVar5) {
            uVar17 = uVar9;
          }
          (cctx->ldmState).window.lowLimit = uVar17;
        }
      }
      if (frame == 0) {
        code_00 = ZSTD_compressBlock_internal(cctx,local_78,dstCapacity,src,srcSize);
      }
      else {
        iVar12 = 1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f);
        srcSize_00 = cctx->blockSize;
        if ((cctx->appliedParams).fParams.checksumFlag != 0) {
          XXH64_update(&cctx->xxhState,src,srcSize);
          code_00 = extraout_RDX_00;
        }
        local_80 = local_78;
        sVar21 = srcSize;
        do {
          if (sVar21 == 0) {
            if ((lastFrameChunk != 0) && (local_78 < local_80)) {
              cctx->stage = ZSTDcs_ending;
            }
            code_00 = (long)local_80 - (long)local_78;
            break;
          }
          bVar8 = false;
          uVar9 = lastFrameChunk & 1;
          if (srcSize_00 < sVar21) {
            uVar9 = 0;
          }
          if (dstCapacity < 6) {
            code_00 = 0xffffffffffffffba;
          }
          else {
            if (sVar21 < srcSize_00) {
              srcSize_00 = sVar21;
            }
            pBVar5 = (cctx->blockState).matchState.window.base;
            iVar13 = (int)pBVar5;
            iVar15 = (int)(void *)((long)src + srcSize_00);
            if (0xe0000000 < (uint)(iVar15 - iVar13)) {
              uVar18 = (int)src - iVar13;
              uVar18 = uVar18 - ((~(-1 << ((char)(cctx->appliedParams).cParams.chainLog -
                                           (ZSTD_lazy2 < (cctx->appliedParams).cParams.strategy) &
                                          0x1fU)) & uVar18) + iVar12);
              (cctx->blockState).matchState.window.base = pBVar5 + uVar18;
              ppBVar1 = &(cctx->blockState).matchState.window.dictBase;
              *ppBVar1 = *ppBVar1 + uVar18;
              uVar2 = (cctx->blockState).matchState.window.dictLimit;
              uVar3 = (cctx->blockState).matchState.window.lowLimit;
              (cctx->blockState).matchState.window.dictLimit = uVar2 - uVar18;
              (cctx->blockState).matchState.window.lowLimit = uVar3 - uVar18;
              ZSTD_reduceIndex(cctx,uVar18);
              uVar17 = (cctx->blockState).matchState.nextToUpdate;
              UVar11 = uVar17 - uVar18;
              if (uVar17 < uVar18) {
                UVar11 = 0;
              }
              (cctx->blockState).matchState.nextToUpdate = UVar11;
              (cctx->blockState).matchState.loadedDictEnd = 0;
            }
            uVar17 = iVar15 - *(int *)&(cctx->blockState).matchState.window.base;
            if ((cctx->blockState).matchState.loadedDictEnd + iVar12 < uVar17) {
              uVar17 = uVar17 - iVar12;
              if ((cctx->blockState).matchState.window.lowLimit < uVar17) {
                (cctx->blockState).matchState.window.lowLimit = uVar17;
              }
              uVar17 = (cctx->blockState).matchState.window.lowLimit;
              if ((cctx->blockState).matchState.window.dictLimit < uVar17) {
                (cctx->blockState).matchState.window.dictLimit = uVar17;
              }
              (cctx->blockState).matchState.loadedDictEnd = 0;
            }
            uVar17 = (cctx->blockState).matchState.window.lowLimit;
            if ((cctx->blockState).matchState.nextToUpdate < uVar17) {
              (cctx->blockState).matchState.nextToUpdate = uVar17;
            }
            code = ZSTD_compressBlock_internal
                             (cctx,(void *)((long)local_80 + 3),dstCapacity - 3,src,srcSize_00);
            uVar17 = ZSTD_isError(code);
            if (uVar17 == 0) {
              if (code == 0) {
                uVar22 = srcSize_00 + 3;
                if (dstCapacity < uVar22) {
                  code_00 = 0xffffffffffffffba;
                  bVar8 = false;
                  goto LAB_00185ffb;
                }
                *local_80 = uVar9 + (int)srcSize_00 * 8;
                memcpy((void *)((long)local_80 + 3),src,srcSize_00);
              }
              else {
                *(short *)local_80 = (short)uVar9 + (short)code * 8 + 4;
                *(char *)((long)local_80 + 2) = (char)(code >> 0xd);
                uVar22 = code + 3;
              }
              sVar21 = sVar21 - srcSize_00;
              local_80 = (int *)((long)local_80 + uVar22);
              dstCapacity = dstCapacity - uVar22;
              bVar8 = true;
              src = (void *)((long)src + srcSize_00);
            }
            else {
              bVar8 = false;
              code_00 = code;
            }
          }
LAB_00185ffb:
        } while (bVar8);
      }
      uVar9 = ZSTD_isError(code_00);
      if (uVar9 == 0) {
        uVar4 = cctx->consumedSrcSize;
        cctx->consumedSrcSize = uVar4 + srcSize;
        sVar14 = code_00 + sVar14;
        cctx->producedCSize = cctx->producedCSize + sVar14;
        code_00 = 0xffffffffffffffb8;
        if (uVar4 + srcSize + 1 <= cctx->pledgedSrcSizePlusOne) {
          code_00 = sVar14;
        }
        if (cctx->pledgedSrcSizePlusOne == 0) {
          code_00 = sVar14;
        }
      }
    }
  }
  return code_00;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (U32)srcSize);
    if (cctx->stage==ZSTDcs_created) return ERROR(stage_wrong);   /* missing init (ZSTD_compressBegin) */

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }

    // Added this: Fixes a crash after 4 GB of input data -cat
    if (ZSTD_window_needOverflowCorrection(ms->window, (char*)src + srcSize)) {
        U32 const cycleLog = ZSTD_cycleLog(cctx->appliedParams.cParams.chainLog, cctx->appliedParams.cParams.strategy);
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, ms->window.lowLimit, (char*)src);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);

        ZSTD_reduceIndex(cctx, correction);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        ms->loadedDictEnd = 0;
    }

    if (cctx->appliedParams.ldmParams.enableLdm)
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (U32)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize);
        if (ZSTD_isError(cSize)) return cSize;
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            if (cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne) {
                DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                    (U32)cctx->pledgedSrcSizePlusOne-1, (U32)cctx->consumedSrcSize);
                return ERROR(srcSize_wrong);
            }
        }
        return cSize + fhSize;
    }
}